

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzinterpolationspace.cpp
# Opt level: O3

void __thiscall TPZInterpolationSpace::~TPZInterpolationSpace(TPZInterpolationSpace *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int TPZInterpolationSpace::MaxOrder(){
	const int n = this->NConnects();
	int result = -1;
	int side;
	for(int i = 0; i < n; i++){
        // skip unidentified connects
        if (ConnectIndex(i) < 0) {
            continue;
        }
		side = this->Connect(i).Order();
		if (side > result) result = side;
	}//i
	return result;
}